

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

void __thiscall
duckdb::DataTable::WriteToLog
          (DataTable *this,DuckTransaction *transaction,WriteAheadLog *log,idx_t row_start,
          idx_t count,optional_ptr<duckdb::StorageCommitState,_true> commit_state)

{
  int iVar1;
  DataTableInfo *pDVar2;
  DataTableInfo *pDVar3;
  undefined4 extraout_var;
  InternalException *this_00;
  idx_t optimistic_count;
  optional_ptr<duckdb::PersistentCollectionData,_true> entry;
  ulong local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  DuckTransaction *local_48;
  optional_ptr<duckdb::PersistentCollectionData,_true> local_40;
  optional_ptr<duckdb::StorageCommitState,_true> local_38;
  
  local_48 = transaction;
  local_38.ptr = commit_state.ptr;
  pDVar2 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  pDVar3 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  WriteAheadLog::WriteSetTable(log,&pDVar2->schema,&pDVar3->table);
  if (commit_state.ptr != (StorageCommitState *)0x0) {
    local_70 = 0;
    optional_ptr<duckdb::StorageCommitState,_true>::CheckValid(&local_38);
    iVar1 = (*(local_38.ptr)->_vptr_StorageCommitState[5])(local_38.ptr,this,row_start,&local_70);
    local_40.ptr = (PersistentCollectionData *)CONCAT44(extraout_var,iVar1);
    if (local_40.ptr != (PersistentCollectionData *)0x0) {
      optional_ptr<duckdb::PersistentCollectionData,_true>::CheckValid(&local_40);
      WriteAheadLog::WriteRowGroupData(log,local_40.ptr);
      if (count < local_70) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_68._M_unused._M_object = &local_58;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   "Optimistically written count cannot exceed actual count (got %llu, but expected count is %llu)"
                   ,"");
        InternalException::InternalException<unsigned_long,unsigned_long>
                  (this_00,(string *)&local_68,local_70,count);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      count = count - local_70;
      if (count == 0) {
        return;
      }
      row_start = row_start + local_70;
    }
  }
  local_68._8_8_ = 0;
  local_50 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/data_table.cpp:1111:50)>
             ::_M_invoke;
  local_58 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/data_table.cpp:1111:50)>
             ::_M_manager;
  local_68._M_unused._M_object = log;
  ScanTableSegment(this,local_48,row_start,count,(function<void_(duckdb::DataChunk_&)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  return;
}

Assistant:

void DataTable::WriteToLog(DuckTransaction &transaction, WriteAheadLog &log, idx_t row_start, idx_t count,
                           optional_ptr<StorageCommitState> commit_state) {
	log.WriteSetTable(info->schema, info->table);
	if (commit_state) {
		idx_t optimistic_count = 0;
		auto entry = commit_state->GetRowGroupData(*this, row_start, optimistic_count);
		if (entry) {
			D_ASSERT(optimistic_count > 0);
			log.WriteRowGroupData(*entry);
			if (optimistic_count > count) {
				throw InternalException(
				    "Optimistically written count cannot exceed actual count (got %llu, but expected count is %llu)",
				    optimistic_count, count);
			}
			// write any remaining (non-optimistically written) rows to the WAL normally
			row_start += optimistic_count;
			count -= optimistic_count;
			if (count == 0) {
				return;
			}
		}
	}
	ScanTableSegment(transaction, row_start, count, [&](DataChunk &chunk) { log.WriteInsert(chunk); });
}